

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O0

void Bdc_ManDecomposeTest(uint uTruth,int nVars)

{
  uint local_3c [2];
  uint uFunc;
  uint uCare;
  int RetValue;
  Bdc_Man_t *p;
  Bdc_Par_t *pPars;
  Bdc_Par_t Pars;
  int nVars_local;
  uint uTruth_local;
  
  Pars.fVerbose = nVars;
  Pars.fVeryVerbose = uTruth;
  memset((void *)((long)&pPars + 4),0,0xc);
  p = (Bdc_Man_t *)((long)&pPars + 4);
  local_3c[1] = 0xffffffff;
  local_3c[0] = Pars.fVeryVerbose;
  pPars._4_4_ = 8;
  _uCare = Bdc_ManAlloc((Bdc_Par_t *)p);
  uFunc = Bdc_ManDecompose(_uCare,local_3c,local_3c + 1,Pars.fVerbose,(Vec_Ptr_t *)0x0,1000);
  Bdc_ManDecomposeTest::Total = uFunc + Bdc_ManDecomposeTest::Total;
  Bdc_ManDecomposeTest::Counter = Bdc_ManDecomposeTest::Counter + 1;
  printf("%5d : Nodes = %5d. Total = %8d.\n",(ulong)(uint)Bdc_ManDecomposeTest::Counter,(ulong)uFunc
         ,(ulong)(uint)Bdc_ManDecomposeTest::Total);
  Bdc_ManFree(_uCare);
  return;
}

Assistant:

void Bdc_ManDecomposeTest( unsigned uTruth, int nVars )
{
    static int Counter = 0;
    static int Total = 0;
    Bdc_Par_t Pars = {0}, * pPars = &Pars;
    Bdc_Man_t * p;
    int RetValue;
//    unsigned uCare = ~0x888f888f;
    unsigned uCare = ~0;
//    unsigned uFunc =  0x88888888;
//    unsigned uFunc =  0xf888f888;
//    unsigned uFunc =  0x117e117e;
//    unsigned uFunc =  0x018b018b;
    unsigned uFunc = uTruth; 

    pPars->nVarsMax = 8;
    p = Bdc_ManAlloc( pPars );
    RetValue = Bdc_ManDecompose( p, &uFunc, &uCare, nVars, NULL, 1000 );
    Total += RetValue;
    printf( "%5d : Nodes = %5d. Total = %8d.\n", ++Counter, RetValue, Total );
//    Bdc_ManDecPrint( p );
    Bdc_ManFree( p );
}